

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool anon_unknown.dwarf_107107::HasMemoryAccess(VmInstructionType cmd)

{
  switch(cmd) {
  case VM_INST_LOAD_BYTE:
  case VM_INST_LOAD_SHORT:
  case VM_INST_LOAD_INT:
  case VM_INST_LOAD_FLOAT:
  case VM_INST_LOAD_DOUBLE:
  case VM_INST_LOAD_LONG:
  case VM_INST_LOAD_STRUCT:
  case VM_INST_STORE_BYTE:
  case VM_INST_STORE_SHORT:
  case VM_INST_STORE_INT:
  case VM_INST_STORE_FLOAT:
  case VM_INST_STORE_DOUBLE:
  case VM_INST_STORE_LONG:
  case VM_INST_STORE_STRUCT:
  case VM_INST_SET_RANGE:
  case VM_INST_MEM_COPY:
  case VM_INST_CALL:
  case VM_INST_ADD_LOAD:
  case VM_INST_SUB_LOAD:
  case VM_INST_MUL_LOAD:
  case VM_INST_DIV_LOAD:
  case VM_INST_POW_LOAD:
  case VM_INST_MOD_LOAD:
  case VM_INST_LESS_LOAD:
  case VM_INST_GREATER_LOAD:
  case VM_INST_LESS_EQUAL_LOAD:
  case VM_INST_GREATER_EQUAL_LOAD:
  case VM_INST_EQUAL_LOAD:
  case VM_INST_NOT_EQUAL_LOAD:
  case VM_INST_SHL_LOAD:
  case VM_INST_SHR_LOAD:
  case VM_INST_BIT_AND_LOAD:
  case VM_INST_BIT_OR_LOAD:
  case VM_INST_BIT_XOR_LOAD:
    return true;
  default:
    return false;
  }
}

Assistant:

bool HasMemoryAccess(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_LOAD_BYTE:
		case VM_INST_LOAD_SHORT:
		case VM_INST_LOAD_INT:
		case VM_INST_LOAD_FLOAT:
		case VM_INST_LOAD_DOUBLE:
		case VM_INST_LOAD_LONG:
		case VM_INST_LOAD_STRUCT:
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
		case VM_INST_SET_RANGE:
		case VM_INST_MEM_COPY:
		case VM_INST_CALL:
		case VM_INST_ADD_LOAD:
		case VM_INST_SUB_LOAD:
		case VM_INST_MUL_LOAD:
		case VM_INST_DIV_LOAD:
		case VM_INST_POW_LOAD:
		case VM_INST_MOD_LOAD:
		case VM_INST_LESS_LOAD:
		case VM_INST_GREATER_LOAD:
		case VM_INST_LESS_EQUAL_LOAD:
		case VM_INST_GREATER_EQUAL_LOAD:
		case VM_INST_EQUAL_LOAD:
		case VM_INST_NOT_EQUAL_LOAD:
		case VM_INST_SHL_LOAD:
		case VM_INST_SHR_LOAD:
		case VM_INST_BIT_AND_LOAD:
		case VM_INST_BIT_OR_LOAD:
		case VM_INST_BIT_XOR_LOAD:
			return true;
		default:
			break;
		}

		// Note: memory access can be performed by reference in VM_INST_RETURN instruction

		return false;
	}